

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O3

void __thiscall reader_url_suite::test_path_absolute_two::test_method(test_path_absolute_two *this)

{
  bool bVar1;
  uint uVar2;
  value vVar3;
  uint local_310;
  value local_30c;
  view_type *local_308;
  uint *local_300;
  view_type local_2f8;
  undefined8 *local_2e8;
  value *local_2e0;
  undefined **local_2d8;
  undefined1 local_2d0;
  undefined8 *local_2c8;
  uint **local_2c0;
  undefined **local_2b8;
  undefined1 local_2b0;
  undefined8 *local_2a8;
  char *local_2a0;
  undefined1 local_298 [8];
  undefined8 local_290;
  shared_count sStack_288;
  char *local_280;
  char *local_278;
  url reader;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char input [17];
  
  local_2f8.ptr_ = input;
  builtin_strncpy(input,"scheme:/path/two",0x11);
  local_2f8.len_ = strlen(local_2f8.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_2f8);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0xae);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_308 = (view_type *)&local_30c;
  local_30c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_300 = &local_310;
  local_298[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == scheme;
  local_310 = 2;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2e0 = (value *)&local_308;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0xaf);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_308 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 6) {
    local_298[0] = *(short *)(reader.super_base<char,_trial::url::reader::basic_url>.current_view.
                              ptr_ + 4) == 0x656d &&
                   *(int *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x65686373;
  }
  else {
    local_298[0] = false;
  }
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (value *)&local_308;
  local_300 = (uint *)0x16fe43;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186358;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xaf,2,2,2,"reader.literal()",&local_2f8,"\"scheme\"",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0xb0);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_298[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_308 = (view_type *)&local_30c;
  local_30c = CONCAT31(local_30c._1_3_,local_298[0]);
  local_310 = CONCAT31(local_310._1_3_,1);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  vVar3 = end;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (value *)&local_308;
  local_300 = &local_310;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb0,2,2,2,"reader.next()",&local_2f8,"true",&local_2d8
            );
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0xb1);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  uVar2 = reader.super_base<char,_trial::url::reader::basic_url>.current_token - scheme;
  local_298[0] = 0;
  if (uVar2 < 0xb) {
    local_298[0] = (&DAT_0017063b)[uVar2];
    vVar3 = *(value *)(&DAT_00170a00 + (ulong)uVar2 * 4);
  }
  local_310 = 3;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (value *)&local_308;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186518;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_30c = vVar3;
  local_308 = (view_type *)&local_30c;
  local_300 = &local_310;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb1,2,2,2,"reader.category()",&local_2f8,
             "url::token::category::path",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0xb2);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_30c = trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                        (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_310 = 6;
  local_298[0] = local_30c == path_segment;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (value *)&local_308;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186558;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = (view_type *)&local_30c;
  local_300 = &local_310;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb2,2,2,2,"reader.code()",&local_2f8,
             "url::token::code::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0xb3);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_298[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_30c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_310 = 8;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (value *)&local_308;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = (view_type *)&local_30c;
  local_300 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb3,2,2,2,"reader.subcode()",&local_2f8,
             "url::token::subcode::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0xb4);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 4) {
    local_298[0] = *(int *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x68746170;
  }
  else {
    local_298[0] = false;
  }
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_308 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = (uint *)0x16ffef;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186698;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = (value *)&local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb4,2,2,2,"reader.literal()",&local_2f8,"\"path\"",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0xb5);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_298[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_30c = CONCAT31(local_30c._1_3_,local_298[0]);
  local_310 = CONCAT31(local_310._1_3_,1);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  vVar3 = end;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_310;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = (view_type *)&local_30c;
  local_2e0 = (value *)&local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb5,2,2,2,"reader.next()",&local_2f8,"true",&local_2d8
            );
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0xb6);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  uVar2 = reader.super_base<char,_trial::url::reader::basic_url>.current_token - scheme;
  local_298[0] = 0;
  if (uVar2 < 0xb) {
    local_298[0] = (&DAT_0017063b)[uVar2];
    vVar3 = *(value *)(&DAT_00170a00 + (ulong)uVar2 * 4);
  }
  local_310 = 3;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186518;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_30c = vVar3;
  local_308 = (view_type *)&local_30c;
  local_300 = &local_310;
  local_2e0 = (value *)&local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb6,2,2,2,"reader.category()",&local_2f8,
             "url::token::category::path",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0xb7);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_30c = trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                        (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_310 = 6;
  local_298[0] = local_30c == path_segment;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186558;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_308 = (view_type *)&local_30c;
  local_300 = &local_310;
  local_2e0 = (value *)&local_308;
  local_2c0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb7,2,2,2,"reader.code()",&local_2f8,
             "url::token::code::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0xb8);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_298[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_30c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_310 = 8;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = (view_type *)&local_30c;
  local_300 = &local_310;
  local_2e0 = (value *)&local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb8,2,2,2,"reader.subcode()",&local_2f8,
             "url::token::subcode::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0xb9);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 3) {
    local_298[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_[2] ==
                   'o' && *(short *)reader.super_base<char,_trial::url::reader::basic_url>.
                                    current_view.ptr_ == 0x7774;
  }
  else {
    local_298[0] = false;
  }
  local_308 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = (uint *)0x174007;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001866d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_2e0 = (value *)&local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb9,2,2,2,"reader.literal()",&local_2f8,"\"two\"",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0xba);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186288;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_30c = CONCAT31(local_30c._1_3_,bVar1);
  local_310 = local_310 & 0xffffff00;
  local_298[0] = !bVar1;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_310;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_300;
  local_308 = (view_type *)&local_30c;
  local_2e0 = (value *)&local_308;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xba,2,2,2,"reader.next()",&local_2f8,"false",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_absolute_two)
{
    const char input[] = "scheme:/path/two";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "two");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}